

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_mesh_builder.cxx
# Opt level: O2

void __thiscall xray_re::xr_mesh_builder::commit(xr_mesh_builder *this,xr_object *object)

{
  xr_surfmap_vec *this_00;
  lw_face_vec *this_01;
  pointer pxVar1;
  pointer p_Var2;
  pointer pbVar3;
  pointer puVar4;
  pointer pbVar5;
  pointer p_Var6;
  pointer p_Var7;
  xr_mesh_builder *pxVar8;
  xr_object *pxVar9;
  xr_surfmap *pxVar10;
  xr_surface *pxVar11;
  ulong uVar12;
  pointer pbVar13;
  pointer pxVar14;
  xr_surfmap *smap;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined4 local_58;
  undefined4 uStack_54;
  b_face_vec *local_50;
  uint32_t face_idx;
  xr_mesh_builder *local_40;
  xr_object *local_38;
  
  local_38 = object;
  compact_raw_surfaces(this);
  this_00 = &(this->super_xr_mesh).m_surfmaps;
  local_50 = (b_face_vec *)&this->m_raw_surfaces;
  std::vector<xray_re::xr_surfmap_*,_std::allocator<xray_re::xr_surfmap_*>_>::reserve
            (this_00,(long)(this->m_raw_surfaces).
                           super__Vector_base<xray_re::xr_raw_surface,_std::allocator<xray_re::xr_raw_surface>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->m_raw_surfaces).
                           super__Vector_base<xray_re::xr_raw_surface,_std::allocator<xray_re::xr_raw_surface>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3);
  pxVar1 = (this->m_raw_surfaces).
           super__Vector_base<xray_re::xr_raw_surface,_std::allocator<xray_re::xr_raw_surface>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_40 = this;
  for (pxVar14 = (this->m_raw_surfaces).
                 super__Vector_base<xray_re::xr_raw_surface,_std::allocator<xray_re::xr_raw_surface>_>
                 ._M_impl.super__Vector_impl_data._M_start; pxVar8 = local_40, pxVar14 != pxVar1;
      pxVar14 = pxVar14 + 1) {
    pxVar10 = (xr_surfmap *)operator_new(0x20);
    pxVar11 = xr_object::attach(local_38,pxVar14);
    pxVar10->surface = pxVar11;
    (pxVar10->faces).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pxVar10->faces).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pxVar10->faces).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    smap = pxVar10;
    std::vector<xray_re::xr_surfmap_*,_std::allocator<xray_re::xr_surfmap_*>_>::push_back
              (this_00,&smap);
  }
  smap = (xr_surfmap *)
         (local_40->m_raw_surfaces).
         super__Vector_base<xray_re::xr_raw_surface,_std::allocator<xray_re::xr_raw_surface>_>.
         _M_impl.super__Vector_impl_data._M_start;
  pxVar14 = (local_40->m_raw_surfaces).
            super__Vector_base<xray_re::xr_raw_surface,_std::allocator<xray_re::xr_raw_surface>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  uStack_60 = SUB84(pxVar14,0);
  uStack_5c = (undefined4)((ulong)pxVar14 >> 0x20);
  pxVar14 = (local_40->m_raw_surfaces).
            super__Vector_base<xray_re::xr_raw_surface,_std::allocator<xray_re::xr_raw_surface>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_58 = SUB84(pxVar14,0);
  uStack_54 = (undefined4)((ulong)pxVar14 >> 0x20);
  (((_Vector_base<xray_re::xr_raw_surface,_std::allocator<xray_re::xr_raw_surface>_> *)
   &local_50->
    super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
   )->_M_impl).super__Vector_impl_data._M_start = (pointer)0x0;
  (((_Vector_base<xray_re::xr_raw_surface,_std::allocator<xray_re::xr_raw_surface>_> *)
   &local_50->
    super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
   )->_M_impl).super__Vector_impl_data._M_finish = (pointer)0x0;
  (((_Vector_base<xray_re::xr_raw_surface,_std::allocator<xray_re::xr_raw_surface>_> *)
   &local_50->
    super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
   )->_M_impl).super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Vector_base<xray_re::xr_raw_surface,_std::allocator<xray_re::xr_raw_surface>_>::
  ~_Vector_base((_Vector_base<xray_re::xr_raw_surface,_std::allocator<xray_re::xr_raw_surface>_> *)
                &smap);
  create_smoothing_groups(pxVar8);
  smap = (xr_surfmap *)
         (pxVar8->m_normals).
         super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>.
         _M_impl.super__Vector_impl_data._M_start;
  p_Var2 = (pxVar8->m_normals).
           super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  uStack_60 = SUB84(p_Var2,0);
  uStack_5c = (undefined4)((ulong)p_Var2 >> 0x20);
  p_Var2 = (pxVar8->m_normals).
           super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_58 = SUB84(p_Var2,0);
  uStack_54 = (undefined4)((ulong)p_Var2 >> 0x20);
  (pxVar8->m_normals).
  super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pxVar8->m_normals).
  super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pxVar8->m_normals).
  super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>::
  ~_Vector_base((_Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
                 *)&smap);
  smap = (xr_surfmap *)
         (pxVar8->m_edges).
         super__Vector_base<xray_re::xr_mesh_builder::b_edge,_std::allocator<xray_re::xr_mesh_builder::b_edge>_>
         ._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (pxVar8->m_edges).
           super__Vector_base<xray_re::xr_mesh_builder::b_edge,_std::allocator<xray_re::xr_mesh_builder::b_edge>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uStack_60 = SUB84(pbVar3,0);
  uStack_5c = (undefined4)((ulong)pbVar3 >> 0x20);
  pbVar3 = (pxVar8->m_edges).
           super__Vector_base<xray_re::xr_mesh_builder::b_edge,_std::allocator<xray_re::xr_mesh_builder::b_edge>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_58 = SUB84(pbVar3,0);
  uStack_54 = (undefined4)((ulong)pbVar3 >> 0x20);
  (pxVar8->m_edges).
  super__Vector_base<xray_re::xr_mesh_builder::b_edge,_std::allocator<xray_re::xr_mesh_builder::b_edge>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pxVar8->m_edges).
  super__Vector_base<xray_re::xr_mesh_builder::b_edge,_std::allocator<xray_re::xr_mesh_builder::b_edge>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pxVar8->m_edges).
  super__Vector_base<xray_re::xr_mesh_builder::b_edge,_std::allocator<xray_re::xr_mesh_builder::b_edge>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  _Vector_base<xray_re::xr_mesh_builder::b_edge,_std::allocator<xray_re::xr_mesh_builder::b_edge>_>
  ::~_Vector_base((_Vector_base<xray_re::xr_mesh_builder::b_edge,_std::allocator<xray_re::xr_mesh_builder::b_edge>_>
                   *)&smap);
  smap = (xr_surfmap *)
         (pxVar8->m_vertex_edges).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
         _M_impl.super__Vector_impl_data._M_start;
  puVar4 = (pxVar8->m_vertex_edges).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  uStack_60 = SUB84(puVar4,0);
  uStack_5c = (undefined4)((ulong)puVar4 >> 0x20);
  puVar4 = (pxVar8->m_vertex_edges).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_58 = SUB84(puVar4,0);
  uStack_54 = (undefined4)((ulong)puVar4 >> 0x20);
  (pxVar8->m_vertex_edges).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pxVar8->m_vertex_edges).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pxVar8->m_vertex_edges).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&smap);
  this_01 = &(pxVar8->super_xr_mesh).m_faces;
  local_50 = &pxVar8->m_faces;
  std::vector<xray_re::lw_face,_std::allocator<xray_re::lw_face>_>::reserve
            (this_01,(long)(pxVar8->m_faces).
                           super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pxVar8->m_faces).
                           super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 6);
  face_idx = 0;
  pbVar13 = (pxVar8->m_faces).
            super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar5 = (pxVar8->m_faces).
           super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    pxVar8 = local_40;
    if (pbVar13 == pbVar5) {
      generate_vertex_faces(local_40);
      pxVar9 = local_38;
      create_mappings(pxVar8,this_01,&(pxVar8->super_xr_mesh).m_vmrefs,
                      &(pxVar8->super_xr_mesh).m_vmaps,&local_38->m_bones);
      smap = (xr_surfmap *)
             (pxVar8->m_texcoords).
             super__Vector_base<xray_re::_vector2<float>,_std::allocator<xray_re::_vector2<float>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      p_Var6 = (pxVar8->m_texcoords).
               super__Vector_base<xray_re::_vector2<float>,_std::allocator<xray_re::_vector2<float>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      uStack_60 = SUB84(p_Var6,0);
      uStack_5c = (undefined4)((ulong)p_Var6 >> 0x20);
      p_Var6 = (pxVar8->m_texcoords).
               super__Vector_base<xray_re::_vector2<float>,_std::allocator<xray_re::_vector2<float>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_58 = SUB84(p_Var6,0);
      uStack_54 = (undefined4)((ulong)p_Var6 >> 0x20);
      (pxVar8->m_texcoords).
      super__Vector_base<xray_re::_vector2<float>,_std::allocator<xray_re::_vector2<float>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pxVar8->m_texcoords).
      super__Vector_base<xray_re::_vector2<float>,_std::allocator<xray_re::_vector2<float>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pxVar8->m_texcoords).
      super__Vector_base<xray_re::_vector2<float>,_std::allocator<xray_re::_vector2<float>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::_Vector_base<xray_re::_vector2<float>,_std::allocator<xray_re::_vector2<float>_>_>::
      ~_Vector_base((_Vector_base<xray_re::_vector2<float>,_std::allocator<xray_re::_vector2<float>_>_>
                     *)&smap);
      smap = (xr_surfmap *)
             (pxVar8->m_influences).
             super__Vector_base<xray_re::_influence<unsigned_int,_float>,_std::allocator<xray_re::_influence<unsigned_int,_float>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      p_Var7 = (pxVar8->m_influences).
               super__Vector_base<xray_re::_influence<unsigned_int,_float>,_std::allocator<xray_re::_influence<unsigned_int,_float>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      uStack_60 = SUB84(p_Var7,0);
      uStack_5c = (undefined4)((ulong)p_Var7 >> 0x20);
      p_Var7 = (pxVar8->m_influences).
               super__Vector_base<xray_re::_influence<unsigned_int,_float>,_std::allocator<xray_re::_influence<unsigned_int,_float>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_58 = SUB84(p_Var7,0);
      uStack_54 = (undefined4)((ulong)p_Var7 >> 0x20);
      (pxVar8->m_influences).
      super__Vector_base<xray_re::_influence<unsigned_int,_float>,_std::allocator<xray_re::_influence<unsigned_int,_float>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pxVar8->m_influences).
      super__Vector_base<xray_re::_influence<unsigned_int,_float>,_std::allocator<xray_re::_influence<unsigned_int,_float>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pxVar8->m_influences).
      super__Vector_base<xray_re::_influence<unsigned_int,_float>,_std::allocator<xray_re::_influence<unsigned_int,_float>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      _Vector_base<xray_re::_influence<unsigned_int,_float>,_std::allocator<xray_re::_influence<unsigned_int,_float>_>_>
      ::~_Vector_base((_Vector_base<xray_re::_influence<unsigned_int,_float>,_std::allocator<xray_re::_influence<unsigned_int,_float>_>_>
                       *)&smap);
      smap = (xr_surfmap *)
             (pxVar8->m_vertex_faces).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
      puVar4 = (pxVar8->m_vertex_faces).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      uStack_60 = SUB84(puVar4,0);
      uStack_5c = (undefined4)((ulong)puVar4 >> 0x20);
      puVar4 = (pxVar8->m_vertex_faces).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      local_58 = SUB84(puVar4,0);
      uStack_54 = (undefined4)((ulong)puVar4 >> 0x20);
      (pxVar8->m_vertex_faces).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pxVar8->m_vertex_faces).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pxVar8->m_vertex_faces).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&smap);
      smap = (xr_surfmap *)
             (pxVar8->m_faces).
             super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
             ._M_impl.super__Vector_impl_data._M_start;
      pbVar13 = (pxVar8->m_faces).
                super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      uStack_60 = SUB84(pbVar13,0);
      uStack_5c = (undefined4)((ulong)pbVar13 >> 0x20);
      pbVar13 = (pxVar8->m_faces).
                super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_58 = SUB84(pbVar13,0);
      uStack_54 = (undefined4)((ulong)pbVar13 >> 0x20);
      (local_50->
      super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
      )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (local_50->
      super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
      )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_50->
      super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      _Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
      ::~_Vector_base((_Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
                       *)&smap);
      xr_mesh::calculate_bbox(&pxVar8->super_xr_mesh);
      smap = (xr_surfmap *)pxVar8;
      std::vector<xray_re::xr_mesh*,std::allocator<xray_re::xr_mesh*>>::
      emplace_back<xray_re::xr_mesh*>
                ((vector<xray_re::xr_mesh*,std::allocator<xray_re::xr_mesh*>> *)&pxVar9->m_meshes,
                 (xr_mesh **)&smap);
      return;
    }
    uStack_60 = (pbVar13->field_0).field_0.v[2];
    smap = *(xr_surfmap **)&pbVar13->field_0;
    uStack_5c = 0xffffffff;
    local_58 = 0xffffffff;
    uStack_54 = 0xffffffff;
    std::vector<xray_re::lw_face,_std::allocator<xray_re::lw_face>_>::emplace_back<xray_re::lw_face>
              (this_01,(lw_face *)&smap);
    uVar12 = (ulong)(pbVar13->field_1).field_1.surf_idx;
    if (uVar12 == 0xffffffff) break;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (&(this_00->
                super__Vector_base<xray_re::xr_surfmap_*,_std::allocator<xray_re::xr_surfmap_*>_>).
                _M_impl.super__Vector_impl_data._M_start[uVar12]->faces,&face_idx);
    pbVar13 = pbVar13 + 1;
    face_idx = face_idx + 1;
  }
  __assert_fail("it->surf_idx != BAD_IDX",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh_builder.cxx"
                ,0x2a4,"void xray_re::xr_mesh_builder::commit(xr_object &)");
}

Assistant:

void xr_mesh_builder::commit(xr_object& object)
{
	compact_raw_surfaces();
	m_surfmaps.reserve(m_raw_surfaces.size());
	for (xr_raw_surface_vec_it it = m_raw_surfaces.begin(), end = m_raw_surfaces.end();
			it != end; ++it) {
		xr_surfmap* smap = new xr_surfmap(object.attach(*it));
		m_surfmaps.push_back(smap);
	}
	xr_raw_surface_vec().swap(m_raw_surfaces);

	create_smoothing_groups();
	std::vector<fvector3>().swap(m_normals);
	b_edge_vec().swap(m_edges);
	std::vector<uint32_t>().swap(m_vertex_edges);

	xr_mesh::m_faces.reserve(m_faces.size());
	uint32_t face_idx = 0;
	for (b_face_vec_it it = m_faces.begin(), end = m_faces.end();
			it != end; ++it, ++face_idx) {
		xr_mesh::m_faces.push_back(lw_face(it->v0, it->v1, it->v2));
		xr_assert(it->surf_idx != BAD_IDX);
		m_surfmaps[it->surf_idx]->faces.push_back(face_idx);
	}

	generate_vertex_faces();
	create_mappings(xr_mesh::m_faces, m_vmrefs, m_vmaps, object.bones());
	std::vector<fvector2>().swap(m_texcoords);
	std::vector<finfluence>().swap(m_influences);
	std::vector<uint32_t>().swap(m_vertex_faces);
	b_face_vec().swap(m_faces);

	calculate_bbox();

	object.meshes().push_back(this);
}